

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_declared_builtin_block
          (CompilerGLSL *this,StorageClass storage,ExecutionModel model)

{
  BuiltIn BVar1;
  int iVar2;
  mapped_type mVar3;
  size_t sVar4;
  Variant *pVVar5;
  Decoration *pDVar6;
  _Hash_node_base *p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint3 uVar10;
  bool bVar11;
  __buckets_ptr *ppp_Var12;
  SPIRVariable *pSVar13;
  __node_base_ptr p_Var14;
  bool bVar15;
  bool bVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  ExecutionModel EVar19;
  SPIRType *pSVar20;
  mapped_type *pmVar21;
  mapped_type *pmVar22;
  _Hash_node_base *p_Var23;
  __node_base_ptr p_Var24;
  SPIREntryPoint *pSVar25;
  runtime_error *prVar26;
  char *pcVar27;
  TypedID<(spirv_cross::Types)0> *pTVar28;
  _Hash_node_base *p_Var29;
  ulong uVar30;
  CompilerGLSL *this_00;
  byte bVar31;
  __node_base_ptr p_Var32;
  __node_base_ptr in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var33;
  TypedID<(spirv_cross::Types)0> *pTVar34;
  uint uVar35;
  long lVar36;
  uint32_t geom_stream;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  uint32_t clip_distance_size;
  uint32_t cull_distance_size;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  builtin_xfb_offsets;
  Bitset emitted_builtins;
  Bitset global_builtins;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Bitset builtins;
  uint32_t local_137c;
  uint local_1378;
  uint32_t local_1374;
  uint32_t local_1370;
  ExecutionModel local_136c;
  uint local_1368;
  uint local_1364;
  SPIRVariable *local_1360;
  CompilerGLSL *local_1358;
  undefined4 local_134c;
  uint local_1348;
  BuiltIn local_1344;
  SPIRType *local_1340;
  StorageClass local_1334;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1330;
  TypedID<(spirv_cross::Types)0> *local_1328;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1320;
  string local_12e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12c8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_12c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1288;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1280;
  undefined1 local_1248 [288];
  undefined1 local_1128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1118;
  long lStack_1108;
  char local_1100 [8];
  char local_10f8 [8];
  __node_base_ptr ap_Stack_10f0 [508];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  local_12c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_12c0._M_buckets = &local_12c0._M_single_bucket;
  local_12c0._M_bucket_count = 1;
  local_12c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_12c0._M_element_count = 0;
  local_12c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_12c0._M_rehash_policy._M_next_resize = 0;
  local_12c0._M_single_bucket = (__node_base_ptr)0x0;
  local_1288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_1280._M_buckets = &local_1280._M_single_bucket;
  local_1280._M_bucket_count = 1;
  local_1280._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1280._M_element_count = 0;
  local_1280._M_rehash_policy._M_max_load_factor = 1.0;
  local_1280._M_rehash_policy._M_next_resize = 0;
  local_1280._M_single_bucket = (__node_base_ptr)0x0;
  local_1364 = 0;
  local_1368 = 0;
  local_1370 = 0;
  local_1374 = 0;
  local_137c = 0;
  local_1320._M_buckets = &local_1320._M_single_bucket;
  local_1320._M_bucket_count = 1;
  local_1320._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1320._M_element_count = 0;
  local_1320._M_rehash_policy._M_max_load_factor = 1.0;
  local_1320._M_rehash_policy._M_next_resize = 0;
  local_1320._M_single_bucket = (__node_base_ptr)0x0;
  local_136c = model;
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar4 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_1358 = this;
  if (sVar4 == 0) {
    bVar31 = 1;
    bVar11 = false;
    uVar35 = 0;
  }
  else {
    pTVar34 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar28 = pTVar34 + sVar4;
    local_1330 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    local_134c = 0;
    bVar11 = false;
    local_1378 = 0;
    local_1348 = 0;
    local_1334 = storage;
    local_1328 = pTVar28;
    do {
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[pTVar34->id].type == TypeVariable) {
        local_1360 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + pTVar34->id);
        pSVar20 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(local_1360->super_IVariant).field_0xc);
        bVar15 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(pSVar20->super_IVariant).self.id,Block);
        local_1128._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1128._8_8_ = ap_Stack_10f0;
        local_1118._M_allocated_capacity = 1;
        local_1118._8_8_ = 0;
        lStack_1108 = 0;
        local_1100[0] = '\0';
        local_1100[1] = '\0';
        local_1100[2] = -0x80;
        local_1100[3] = '?';
        local_10f8[0] = '\0';
        local_10f8[1] = '\0';
        local_10f8[2] = '\0';
        local_10f8[3] = '\0';
        local_10f8[4] = '\0';
        local_10f8[5] = '\0';
        local_10f8[6] = '\0';
        local_10f8[7] = '\0';
        ap_Stack_10f0[0] = (__node_base_ptr)0x0;
        local_1340 = pSVar20;
        if ((bVar15 && local_1360->storage == storage) &&
           (bVar16 = Compiler::is_builtin_variable(&this->super_Compiler,local_1360), bVar16)) {
          pmVar21 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1330,&(local_1340->super_IVariant).self);
          sVar4 = (pmVar21->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
          if (sVar4 != 0) {
            pDVar6 = (pmVar21->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
            lVar36 = 0;
            uVar30 = 0;
            do {
              if (((*(char *)((long)(pDVar6->extended).values + lVar36 + -0x44) == '\x01') &&
                  (BVar1 = *(BuiltIn *)((long)(pDVar6->extended).values + lVar36 + -0x80),
                  BVar1 < BuiltInVertexId)) && (BVar1 != 2)) {
                local_1344 = BVar1;
                if (BVar1 < 0x40) {
                  local_1128._0_8_ = local_1128._0_8_ | 1L << ((byte)BVar1 & 0x3f);
                }
                else {
                  local_1248._0_8_ = local_1128 + 8;
                  ::std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_1248._0_8_,&local_1344,local_1248);
                }
                iVar2 = *(int *)((long)(pDVar6->extended).values + lVar36 + -0x80);
                if (iVar2 == 3) {
                  pSVar20 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (local_1340->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                       .ptr[uVar30].id);
                  local_1368 = to_array_size_literal
                                         (this,pSVar20,
                                          (int)(pSVar20->array).super_VectorView<unsigned_int>.
                                               buffer_size - 1);
                }
                else if (iVar2 == 4) {
                  pSVar20 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (local_1340->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                       .ptr[uVar30].id);
                  local_1364 = to_array_size_literal
                                         (this,pSVar20,
                                          (int)(pSVar20->array).super_VectorView<unsigned_int>.
                                               buffer_size - 1);
                }
                uVar35 = *(uint *)((long)(pDVar6->extended).values + lVar36 + -0x80);
                if (((uVar35 < 5) && (uVar35 != 2)) &&
                   ((*(byte *)((long)&(pDVar6->decoration_flags).lower + lVar36 + 4) & 8) != 0)) {
                  mVar3 = *(mapped_type *)((long)(pDVar6->extended).values + lVar36 + -0x6c);
                  local_1248._0_4_ = uVar35;
                  pmVar22 = ::std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_1320,(key_type *)local_1248);
                  *pmVar22 = mVar3;
                  local_134c = (undefined4)CONCAT71((int7)((ulong)pmVar22 >> 8),1);
                  this = local_1358;
                }
                uVar35 = *(uint *)((long)(pDVar6->extended).values + lVar36 + -0x80);
                if (((uVar35 < 5) && (uVar35 != 2)) &&
                   ((*(byte *)((long)&(pDVar6->decoration_flags).lower + lVar36 + 3) & 0x20) != 0))
                {
                  uVar17 = *(uint32_t *)((long)(pDVar6->extended).values + lVar36 + -0x60);
                  if ((bVar11) && (local_137c != uVar17)) {
                    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error(prVar26,"IO block member Stream mismatch.");
                    *(undefined ***)prVar26 = &PTR__runtime_error_0050aef0;
                    __cxa_throw(prVar26,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  bVar11 = true;
                  local_137c = uVar17;
                }
              }
              uVar30 = (ulong)((int)uVar30 + 1);
              lVar36 = lVar36 + 0x188;
            } while (sVar4 * 0x188 - lVar36 != 0);
          }
          storage = local_1334;
          pSVar13 = local_1360;
          if (((local_1334 == Output) &&
              (bVar15 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(local_1360->super_IVariant).self.id,
                                   DecorationXfbBuffer), bVar15)) &&
             (bVar15 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                                  DecorationXfbStride), bVar15)) {
            uVar17 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                                DecorationXfbBuffer);
            uVar18 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                                DecorationXfbStride);
            if ((local_1378 & 1) != 0) {
              if (uVar17 != local_1374) {
                prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::runtime_error::runtime_error(prVar26,"IO block member XfbBuffer mismatch.");
LAB_0032d9fe:
                *(undefined ***)prVar26 = &PTR__runtime_error_0050aef0;
                __cxa_throw(prVar26,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              if (uVar18 != local_1370) {
                prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::runtime_error::runtime_error(prVar26,"IO block member XfbBuffer mismatch.");
                goto LAB_0032d9fe;
              }
            }
            local_1378 = (uint)CONCAT71((uint7)(uint3)(uVar18 >> 8),1);
            this = local_1358;
            local_1374 = uVar17;
            local_1370 = uVar18;
          }
          if ((storage == Output) &&
             (bVar15 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                                  DecorationStream), bVar15)) {
            uVar17 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                                DecorationStream);
            if ((bVar11) && (local_137c != uVar17)) {
              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error(prVar26,"IO block member Stream mismatch.");
              *(undefined ***)prVar26 = &PTR__runtime_error_0050aef0;
              __cxa_throw(prVar26,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
LAB_0032cfb5:
            local_137c = uVar17;
            bVar11 = true;
          }
        }
        else if ((!bVar15 && local_1360->storage == storage) &&
                (bVar15 = Compiler::is_builtin_variable(&this->super_Compiler,local_1360), bVar15))
        {
          local_1360 = (SPIRVariable *)&(local_1360->super_IVariant).self;
          pmVar21 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1330,(key_type *)local_1360);
          if ((((pmVar21->decoration).builtin == true) &&
              (BVar1 = (pmVar21->decoration).builtin_type, BVar1 < BuiltInVertexId)) && (BVar1 != 2)
             ) {
            local_1344 = BVar1;
            if (BVar1 < 0x40) {
              local_1288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)((ulong)local_1288 | 1L << ((byte)BVar1 & 0x3f));
            }
            else {
              local_1248._0_8_ = &local_1280;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_1248._0_8_,&local_1344,local_1248);
            }
            BVar1 = (pmVar21->decoration).builtin_type;
            if (BVar1 == BuiltInClipDistance) {
              local_1368 = to_array_size_literal(this,local_1340,0);
            }
            else if (BVar1 == BuiltInCullDistance) {
              local_1364 = to_array_size_literal(this,local_1340,0);
            }
            BVar1 = (pmVar21->decoration).builtin_type;
            if (((BVar1 < BuiltInVertexId) && (BVar1 != 2)) &&
               ((~(pmVar21->decoration).decoration_flags.lower & 0x3800000000) == 0)) {
              uVar17 = (pmVar21->decoration).offset;
              local_1248._0_4_ = BVar1;
              pmVar22 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&local_1320,(key_type *)local_1248);
              *pmVar22 = uVar17;
              uVar17 = (pmVar21->decoration).xfb_buffer;
              uVar18 = (pmVar21->decoration).xfb_stride;
              if ((local_1378 & 1) != 0) {
                if (uVar17 != local_1374) {
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ::std::runtime_error::runtime_error(prVar26,"IO block member XfbBuffer mismatch.")
                  ;
LAB_0032da58:
                  *(undefined ***)prVar26 = &PTR__runtime_error_0050aef0;
                  __cxa_throw(prVar26,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                if (uVar18 != local_1370) {
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ::std::runtime_error::runtime_error(prVar26,"IO block member XfbBuffer mismatch.")
                  ;
                  goto LAB_0032da58;
                }
              }
              uVar10 = (uint3)(uVar17 >> 8);
              local_134c = (undefined4)CONCAT71((uint7)uVar10,1);
              local_1378 = CONCAT31(uVar10,1);
              this = local_1358;
              local_1374 = uVar17;
              local_1370 = uVar18;
            }
            BVar1 = (pmVar21->decoration).builtin_type;
            if (((BVar1 < BuiltInVertexId) && (BVar1 != 2)) &&
               (((pmVar21->decoration).decoration_flags.lower & 0x20000000) != 0)) {
              uVar17 = Compiler::get_decoration
                                 (&this->super_Compiler,
                                  (ID)*(uint32_t *)&(local_1360->super_IVariant)._vptr_IVariant,
                                  DecorationStream);
              if ((bVar11) && (local_137c != uVar17)) {
                prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::runtime_error::runtime_error(prVar26,"IO block member Stream mismatch.");
                *(undefined ***)prVar26 = &PTR__runtime_error_0050aef0;
                __cxa_throw(prVar26,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              goto LAB_0032cfb5;
            }
          }
        }
        if (lStack_1108 != 0 ||
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if ((local_1348 & 1) != 0) {
            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (prVar26,"Cannot use more than one builtin I/O block.");
            *(undefined ***)prVar26 = &PTR__runtime_error_0050aef0;
            __cxa_throw(prVar26,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_12c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1128._0_8_;
          local_1348 = (uint)CONCAT71(SUB87(local_1128._0_8_,1),1);
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_12c0,
                     (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(local_1128 + 8));
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)(local_1128 + 8));
        pTVar28 = local_1328;
      }
      pTVar34 = pTVar34 + 1;
    } while (pTVar34 != pTVar28);
    bVar31 = (byte)local_1378 & (byte)local_134c ^ 1;
    uVar35 = local_1348;
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_12e8);
  local_1288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)((uint)local_1288 & 0x1b);
  pcVar27 = (char *)ap_Stack_10f0;
  local_1118._M_allocated_capacity = 1;
  local_1118._8_8_ = 0;
  lStack_1108._0_1_ = '\0';
  lStack_1108._1_1_ = '\0';
  lStack_1108._2_1_ = '\0';
  lStack_1108._3_1_ = '\0';
  lStack_1108._4_1_ = '\0';
  lStack_1108._5_1_ = '\0';
  lStack_1108._6_1_ = '\0';
  lStack_1108._7_1_ = '\0';
  local_1100[0] = '\0';
  local_1100[1] = '\0';
  local_1100[2] = -0x80;
  local_1100[3] = '?';
  local_10f8[0] = '\0';
  local_10f8[1] = '\0';
  local_10f8[2] = '\0';
  local_10f8[3] = '\0';
  local_10f8[4] = '\0';
  local_10f8[5] = '\0';
  local_10f8[6] = '\0';
  local_10f8[7] = '\0';
  ap_Stack_10f0[0] = (__node_base_ptr)0x0;
  local_1128._0_8_ = local_1288;
  local_1128._8_8_ = pcVar27;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign(&local_1280,
                   (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(local_1128 + 8));
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_1128 + 8));
  this_00 = local_1358;
  if ((uVar35 & 1) == 0) {
    local_12c8 = local_1288;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_12c0,&local_1280);
  }
  if (local_12c0._M_element_count != 0 ||
      local_12c8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    if (storage == Output) {
      local_1248._0_8_ = local_1248 + 0x18;
      local_1248._8_8_ = 0;
      local_1248._16_8_ = 8;
      if ((bVar31 & 1) == 0) {
        if ((this_00->options).es != false) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar26,"Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
          goto LAB_0032daee;
        }
        uVar35 = (this_00->options).version;
        if (uVar35 - 0x8c < 300) {
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_enhanced_layouts","");
          require_extension_internal(this_00,(string *)local_1128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1128._0_8_ != &local_1118) {
            operator_delete((void *)local_1128._0_8_);
          }
        }
        else if (uVar35 < 0x8c) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar26,"Component decoration is not supported in targets below GLSL 1.40.");
          goto LAB_0032daee;
        }
        if (((this_00->options).es == false) && ((this_00->options).version < 0x1b8)) {
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_enhanced_layouts","");
          require_extension_internal(this_00,(string *)local_1128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1128._0_8_ != &local_1118) {
            operator_delete((void *)local_1128._0_8_);
          }
        }
        pcVar27 = ", xfb_stride = ";
        join<char_const(&)[14],unsigned_int&,char_const(&)[16],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&local_1374,
                   (uint *)", xfb_stride = ",(char (*) [16])&local_1370,(uint *)in_R9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1248,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        this_00 = local_1358;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ != &local_1118) {
          operator_delete((void *)local_1128._0_8_);
          this_00 = local_1358;
        }
      }
      if (bVar11) {
        EVar19 = Compiler::get_execution_model(&this_00->super_Compiler);
        if (EVar19 != ExecutionModelGeometry) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar26,"Geometry streams can only be used in geometry shaders.");
LAB_0032daee:
          *(undefined ***)prVar26 = &PTR__runtime_error_0050aef0;
          __cxa_throw(prVar26,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((this_00->options).es == true) {
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar26,"Multiple geometry streams not supported in ESSL.");
          goto LAB_0032daee;
        }
        if ((this_00->options).version < 400) {
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_transform_feedback3","");
          require_extension_internal(this_00,(string *)local_1128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1128._0_8_ != &local_1118) {
            operator_delete((void *)local_1128._0_8_);
          }
        }
        join<char_const(&)[10],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)"stream = ",(char (*) [10])&local_137c,
                   (uint *)pcVar27);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1248,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        this_00 = local_1358;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ != &local_1118) {
          operator_delete((void *)local_1128._0_8_);
          this_00 = local_1358;
        }
      }
      if (local_136c == ExecutionModelMeshEXT) {
        statement<char_const(&)[24]>(this_00,(char (*) [24])"out gl_MeshPerVertexEXT");
      }
      else if (local_1248._8_8_ == 0) {
        statement<char_const(&)[17]>(this_00,(char (*) [17])0x40f5b1);
      }
      else {
        local_110 = local_f8;
        local_1128._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1128._8_8_ = (__node_base_ptr *)0x0;
        local_1118._M_allocated_capacity = 0;
        sStack_108 = 0;
        local_100 = 8;
        StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
        if (local_1248._8_8_ != 0) {
          ppp_Var12 = (__buckets_ptr *)local_1248._0_8_;
          lVar36 = local_1248._8_8_ * 4;
          p_Var33 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_1248._0_8_;
          do {
            StringStream<4096UL,_4096UL>::append
                      ((StringStream<4096UL,_4096UL> *)local_1128,(char *)p_Var33->_M_buckets,
                       p_Var33->_M_bucket_count);
            if (p_Var33 !=
                (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_1248._0_8_ + (local_1248._8_8_ - 1) * 0x20)) {
              StringStream<4096UL,_4096UL>::append
                        ((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
            }
            p_Var33 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&p_Var33->_M_rehash_policy;
          } while (p_Var33 !=
                   (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(ppp_Var12 + lVar36));
        }
        StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_12e8,local_1128);
        StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
        this_00 = local_1358;
        statement<char_const(&)[8],std::__cxx11::string,char_const(&)[19]>
                  (local_1358,(char (*) [8])"layout(",&local_12e8,
                   (char (*) [19])") out gl_PerVertex");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
          operator_delete(local_12e8._M_dataplus._M_p);
        }
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1248);
    }
    else {
      pSVar25 = Compiler::get_entry_point(&this_00->super_Compiler);
      if (pSVar25->geometry_passthrough == true) {
        statement<char_const(&)[36]>(this_00,(char (*) [36])"layout(passthrough) in gl_PerVertex");
      }
      else {
        statement<char_const(&)[16]>(this_00,(char (*) [16])0x40f5d6);
      }
    }
    statement<char_const(&)[2]>(this_00,(char (*) [2])0x3f7378);
    this_00->indent = this_00->indent + 1;
    if (((ulong)local_12c8 & 1) != 0) {
      p_Var32 = *local_1320._M_buckets;
      if (p_Var32 == (__node_base_ptr)0x0) {
LAB_0032d50a:
        p_Var23 = (_Hash_node_base *)0x0;
      }
      else {
        uVar35 = *(uint *)&p_Var32->_M_nxt[1]._M_nxt;
        p_Var29 = p_Var32->_M_nxt;
        do {
          p_Var23 = p_Var32;
          if (uVar35 == 0) break;
          p_Var7 = p_Var29->_M_nxt;
          if (p_Var7 == (_Hash_node_base *)0x0) goto LAB_0032d50a;
          uVar35 = *(uint *)&p_Var7[1]._M_nxt;
          p_Var23 = (_Hash_node_base *)0x0;
          p_Var32 = p_Var29;
          p_Var29 = p_Var7;
        } while ((ulong)uVar35 % local_1320._M_bucket_count == 0);
      }
      if (p_Var23 == (_Hash_node_base *)0x0) {
        p_Var29 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var29 = p_Var23->_M_nxt;
      }
      if (p_Var29 == (_Hash_node_base *)0x0) {
        if ((this_00->super_Compiler).position_invariant == true) {
          statement<char_const(&)[28]>(this_00,(char (*) [28])"invariant vec4 gl_Position;");
        }
        else {
          statement<char_const(&)[18]>(this_00,(char (*) [18])0x40f5fd);
        }
      }
      else {
        statement<char_const(&)[21],unsigned_int&,char_const(&)[20]>
                  (this_00,(char (*) [21])"layout(xfb_offset = ",
                   (uint *)((long)&p_Var29[1]._M_nxt + 4),(char (*) [20])") vec4 gl_Position;");
      }
    }
    if (((ulong)local_12c8 & 2) != 0) {
      p_Var32 = local_1320._M_buckets[local_1320._M_bucket_count != 1];
      if (p_Var32 == (__node_base_ptr)0x0) {
LAB_0032d5c1:
        p_Var24 = (__node_base_ptr)0x0;
        p_Var14 = in_R9;
      }
      else {
        uVar35 = *(uint *)&p_Var32->_M_nxt[1]._M_nxt;
        p_Var29 = p_Var32->_M_nxt;
        p_Var14 = in_R9;
        do {
          in_R9 = p_Var29;
          p_Var24 = p_Var32;
          if (uVar35 == 1) break;
          p_Var29 = in_R9->_M_nxt;
          if (p_Var29 == (_Hash_node_base *)0x0) goto LAB_0032d5c1;
          uVar35 = *(uint *)&p_Var29[1]._M_nxt;
          p_Var24 = (__node_base_ptr)0x0;
          p_Var14 = in_R9;
          p_Var32 = in_R9;
        } while ((uint)((ulong)uVar35 % local_1320._M_bucket_count) ==
                 (uint)(local_1320._M_bucket_count != 1));
      }
      in_R9 = p_Var14;
      if (p_Var24 == (__node_base_ptr)0x0) {
        p_Var29 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var29 = p_Var24->_M_nxt;
      }
      if (p_Var29 == (_Hash_node_base *)0x0) {
        statement<char_const(&)[20]>(this_00,(char (*) [20])0x40f62d);
      }
      else {
        statement<char_const(&)[21],unsigned_int&,char_const(&)[22]>
                  (this_00,(char (*) [21])"layout(xfb_offset = ",
                   (uint *)((long)&p_Var29[1]._M_nxt + 4),(char (*) [22])") float gl_PointSize;");
      }
    }
    if (((ulong)local_12c8 & 8) != 0) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1320._M_bucket_count;
      uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
      p_Var32 = local_1320._M_buckets[uVar30 & 0xffffffff];
      in_R9 = (__node_base_ptr)0x0;
      if ((p_Var32 != (__node_base_ptr)0x0) &&
         (p_Var29 = p_Var32->_M_nxt, in_R9 = p_Var32, *(int *)&p_Var32->_M_nxt[1]._M_nxt != 3)) {
        while (p_Var23 = p_Var29, p_Var29 = p_Var23->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
          in_R9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var29[1]._M_nxt % local_1320._M_bucket_count != uVar30) ||
             (in_R9 = p_Var23, *(uint *)&p_Var29[1]._M_nxt == 3)) goto LAB_0032d66e;
        }
        in_R9 = (__node_base_ptr)0x0;
      }
LAB_0032d66e:
      if (in_R9 == (__node_base_ptr)0x0) {
        p_Var29 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var29 = in_R9->_M_nxt;
      }
      if (p_Var29 == (_Hash_node_base *)0x0) {
        statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                  (this_00,(char (*) [23])0x40f643,&local_1368,(char (*) [3])0x3f4a35);
      }
      else {
        in_R9 = (__node_base_ptr)0x3f4a35;
        statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                  (this_00,(char (*) [21])"layout(xfb_offset = ",
                   (uint *)((long)&p_Var29[1]._M_nxt + 4),(char (*) [25])") float gl_ClipDistance[",
                   &local_1368,(char (*) [3])0x3f4a35);
      }
    }
    if (((ulong)local_12c8 & 0x10) != 0) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1320._M_bucket_count;
      uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar9,0);
      p_Var32 = local_1320._M_buckets[uVar30 & 0xffffffff];
      in_R9 = (__node_base_ptr)0x0;
      if ((p_Var32 != (__node_base_ptr)0x0) &&
         (p_Var29 = p_Var32->_M_nxt, in_R9 = p_Var32, *(int *)&p_Var32->_M_nxt[1]._M_nxt != 4)) {
        while (p_Var32 = p_Var29, p_Var29 = p_Var32->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
          in_R9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var29[1]._M_nxt % local_1320._M_bucket_count != uVar30) ||
             (in_R9 = p_Var32, *(uint *)&p_Var29[1]._M_nxt == 4)) goto LAB_0032d731;
        }
        in_R9 = (__node_base_ptr)0x0;
      }
LAB_0032d731:
      if (in_R9 == (__node_base_ptr)0x0) {
        p_Var29 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var29 = in_R9->_M_nxt;
      }
      if (p_Var29 == (_Hash_node_base *)0x0) {
        statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                  (this_00,(char (*) [23])0x40f65c,&local_1364,(char (*) [3])0x3f4a35);
      }
      else {
        in_R9 = (__node_base_ptr)0x3f4a35;
        statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                  (this_00,(char (*) [21])"layout(xfb_offset = ",
                   (uint *)((long)&p_Var29[1]._M_nxt + 4),(char (*) [25])") float gl_CullDistance[",
                   &local_1364,(char (*) [3])0x3f4a35);
      }
    }
    if (((local_136c == ExecutionModelTessellationControl) ||
        (local_136c == ExecutionModelMeshEXT && (storage ^ Output) == StorageClassUniformConstant))
       || ((local_136c & ~ExecutionModelTessellationControl) == ExecutionModelTessellationEvaluation
           && storage == Input)) {
      pcVar27 = "gl_out";
      if (storage == Input) {
        pcVar27 = "gl_in";
      }
      local_1248._0_8_ = "gl_MeshVerticesEXT";
      if (local_136c != ExecutionModelMeshEXT) {
        local_1248._0_8_ = pcVar27;
      }
      if ((storage ^ Output) == StorageClassUniformConstant &&
          (local_136c ^ ExecutionModelTessellationControl) == ExecutionModelVertex) {
        pSVar25 = Compiler::get_entry_point(&this_00->super_Compiler);
        join<char_const*&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  ((string *)local_1128,(spirv_cross *)local_1248,(char **)0x3b5810,
                   (char (*) [2])&pSVar25->output_vertices,(uint *)0x3f5e45,(char (*) [2])in_R9);
        end_scope_decl(this_00,(string *)local_1128);
      }
      else {
        join<char_const*&,char_const(&)[3]>
                  ((string *)local_1128,(spirv_cross *)local_1248,(char **)"[]",
                   (char (*) [3])(ulong)(local_136c ^ ExecutionModelTessellationControl));
        end_scope_decl(this_00,(string *)local_1128);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    else {
      end_scope_decl(this_00);
    }
    statement<char_const(&)[1]>(this_00,(char (*) [1])0x3edd35);
  }
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1320);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_1280);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_12c0);
  return;
}

Assistant:

void CompilerGLSL::emit_declared_builtin_block(StorageClass storage, ExecutionModel model)
{
	Bitset emitted_builtins;
	Bitset global_builtins;
	const SPIRVariable *block_var = nullptr;
	bool emitted_block = false;

	// Need to use declared size in the type.
	// These variables might have been declared, but not statically used, so we haven't deduced their size yet.
	uint32_t cull_distance_size = 0;
	uint32_t clip_distance_size = 0;

	bool have_xfb_buffer_stride = false;
	bool have_geom_stream = false;
	bool have_any_xfb_offset = false;
	uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;
	std::unordered_map<uint32_t, uint32_t> builtin_xfb_offsets;

	const auto builtin_is_per_vertex_set = [](BuiltIn builtin) -> bool {
		return builtin == BuiltInPosition || builtin == BuiltInPointSize ||
			builtin == BuiltInClipDistance || builtin == BuiltInCullDistance;
	};

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		Bitset builtins;

		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t index = 0;
			for (auto &m : ir.meta[type.self].members)
			{
				if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
				{
					builtins.set(m.builtin_type);
					if (m.builtin_type == BuiltInCullDistance)
						cull_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));
					else if (m.builtin_type == BuiltInClipDistance)
						clip_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationOffset))
					{
						have_any_xfb_offset = true;
						builtin_xfb_offsets[m.builtin_type] = m.offset;
					}

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
					{
						uint32_t stream = m.stream;
						if (have_geom_stream && geom_stream != stream)
							SPIRV_CROSS_THROW("IO block member Stream mismatch.");
						have_geom_stream = true;
						geom_stream = stream;
					}
				}
				index++;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationXfbBuffer) &&
			    has_decoration(var.self, DecorationXfbStride))
			{
				uint32_t buffer_index = get_decoration(var.self, DecorationXfbBuffer);
				uint32_t stride = get_decoration(var.self, DecorationXfbStride);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
				xfb_stride = stride;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationStream))
			{
				uint32_t stream = get_decoration(var.self, DecorationStream);
				if (have_geom_stream && geom_stream != stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = stream;
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			// While we're at it, collect all declared global builtins (HLSL mostly ...).
			auto &m = ir.meta[var.self].decoration;
			if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
			{
				// For mesh/tesc output, Clip/Cull is an array-of-array. Look at innermost array type
				// for correct result.
				global_builtins.set(m.builtin_type);
				if (m.builtin_type == BuiltInCullDistance)
					cull_distance_size = to_array_size_literal(type, 0);
				else if (m.builtin_type == BuiltInClipDistance)
					clip_distance_size = to_array_size_literal(type, 0);

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationXfbStride) &&
				    m.decoration_flags.get(DecorationXfbBuffer) && m.decoration_flags.get(DecorationOffset))
				{
					have_any_xfb_offset = true;
					builtin_xfb_offsets[m.builtin_type] = m.offset;
					uint32_t buffer_index = m.xfb_buffer;
					uint32_t stride = m.xfb_stride;
					if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					if (have_xfb_buffer_stride && stride != xfb_stride)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					have_xfb_buffer_stride = true;
					xfb_buffer = buffer_index;
					xfb_stride = stride;
				}

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
				{
					uint32_t stream = get_decoration(var.self, DecorationStream);
					if (have_geom_stream && geom_stream != stream)
						SPIRV_CROSS_THROW("IO block member Stream mismatch.");
					have_geom_stream = true;
					geom_stream = stream;
				}
			}
		}

		if (builtins.empty())
			return;

		if (emitted_block)
			SPIRV_CROSS_THROW("Cannot use more than one builtin I/O block.");

		emitted_builtins = builtins;
		emitted_block = true;
		block_var = &var;
	});

	global_builtins =
	    Bitset(global_builtins.get_lower() & ((1ull << BuiltInPosition) | (1ull << BuiltInPointSize) |
	                                          (1ull << BuiltInClipDistance) | (1ull << BuiltInCullDistance)));

	// Try to collect all other declared builtins.
	if (!emitted_block)
		emitted_builtins = global_builtins;

	// Can't declare an empty interface block.
	if (emitted_builtins.empty())
		return;

	if (storage == StorageClassOutput)
	{
		SmallVector<string> attr;
		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			if (!options.es)
			{
				if (options.version < 440 && options.version >= 140)
					require_extension_internal("GL_ARB_enhanced_layouts");
				else if (options.version < 140)
					SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
				if (!options.es && options.version < 440)
					require_extension_internal("GL_ARB_enhanced_layouts");
			}
			else if (options.es)
				SPIRV_CROSS_THROW("Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
			attr.push_back(join("xfb_buffer = ", xfb_buffer, ", xfb_stride = ", xfb_stride));
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", geom_stream));
		}

		if (model == ExecutionModelMeshEXT)
			statement("out gl_MeshPerVertexEXT");
		else if (!attr.empty())
			statement("layout(", merge(attr), ") out gl_PerVertex");
		else
			statement("out gl_PerVertex");
	}
	else
	{
		// If we have passthrough, there is no way PerVertex cannot be passthrough.
		if (get_entry_point().geometry_passthrough)
			statement("layout(passthrough) in gl_PerVertex");
		else
			statement("in gl_PerVertex");
	}

	begin_scope();
	if (emitted_builtins.get(BuiltInPosition))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPosition);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") vec4 gl_Position;");
		else if (position_invariant)
			statement("invariant vec4 gl_Position;");
		else
			statement("vec4 gl_Position;");
	}

	if (emitted_builtins.get(BuiltInPointSize))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPointSize);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_PointSize;");
		else
			statement("float gl_PointSize;");
	}

	if (emitted_builtins.get(BuiltInClipDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInClipDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_ClipDistance[", clip_distance_size, "];");
		else
			statement("float gl_ClipDistance[", clip_distance_size, "];");
	}

	if (emitted_builtins.get(BuiltInCullDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInCullDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_CullDistance[", cull_distance_size, "];");
		else
			statement("float gl_CullDistance[", cull_distance_size, "];");
	}

	bool builtin_array = model == ExecutionModelTessellationControl ||
	                     (model == ExecutionModelMeshEXT && storage == StorageClassOutput) ||
	                     (model == ExecutionModelGeometry && storage == StorageClassInput) ||
	                     (model == ExecutionModelTessellationEvaluation && storage == StorageClassInput);

	if (builtin_array)
	{
		const char *instance_name;
		if (model == ExecutionModelMeshEXT)
			instance_name = "gl_MeshVerticesEXT"; // Per primitive is never synthesized.
		else
			instance_name = storage == StorageClassInput ? "gl_in" : "gl_out";

		if (model == ExecutionModelTessellationControl && storage == StorageClassOutput)
			end_scope_decl(join(instance_name, "[", get_entry_point().output_vertices, "]"));
		else
			end_scope_decl(join(instance_name, "[]"));
	}
	else
		end_scope_decl();
	statement("");
}